

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

bool __thiscall
el::base::Storage::uninstallCustomFormatSpecifier(Storage *this,char *formatSpecifier)

{
  int iVar1;
  __normal_iterator<el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
  __position;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<el::CustomFormatSpecifier*,std::vector<el::CustomFormatSpecifier,std::allocator<el::CustomFormatSpecifier>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                         ((this->m_customFormatSpecifiers).
                          super__Vector_base<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->m_customFormatSpecifiers).
                          super__Vector_base<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  if ((__position._M_current !=
       (this->m_customFormatSpecifiers).
       super__Vector_base<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>.
       _M_impl.super__Vector_impl_data._M_finish) &&
     (iVar1 = strcmp(formatSpecifier,(__position._M_current)->m_formatSpecifier), iVar1 == 0)) {
    utils::std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::
    _M_erase(&this->m_customFormatSpecifiers,(iterator)__position._M_current);
    return true;
  }
  return false;
}

Assistant:

bool Storage::uninstallCustomFormatSpecifier(const char* formatSpecifier) {
  base::threading::ScopedLock scopedLock(customFormatSpecifiersLock());
  std::vector<CustomFormatSpecifier>::iterator it = std::find(m_customFormatSpecifiers.begin(),
      m_customFormatSpecifiers.end(), formatSpecifier);
  if (it != m_customFormatSpecifiers.end() && strcmp(formatSpecifier, it->formatSpecifier()) == 0) {
    m_customFormatSpecifiers.erase(it);
    return true;
  }
  return false;
}